

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O0

void __thiscall cppcms::widgets::numeric<int>::load(numeric<int> *this,context *context)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  pointer ppVar4;
  ulong uVar5;
  long *in_RDI;
  istringstream ss;
  form_type *request;
  const_iterator p;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffdd8;
  locale local_1f0 [8];
  locale local_1e8 [8];
  istringstream local_1e0 [384];
  _Self local_60 [3];
  string local_48 [32];
  _Base_ptr local_28;
  undefined8 local_20;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_18 [3];
  
  cppcms::widgets::base_widget::pre_load((context *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
  std::__cxx11::string::clear();
  cVar1 = (char)in_RDI;
  cppcms::widgets::base_widget::set((bool)(cVar1 + (char)*(undefined8 *)(*in_RDI + -0x18)));
  cppcms::widgets::base_widget::valid((bool)(cVar1 + (char)*(undefined8 *)(*in_RDI + -0x18)));
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(local_18);
  cppcms::http::context::request();
  local_20 = cppcms::http::request::post_or_get_abi_cxx11_();
  cppcms::widgets::base_widget::name_abi_cxx11_();
  local_28 = (_Base_ptr)
             std::
             multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(in_stack_fffffffffffffdd8,(key_type *)0x13b09f);
  local_18[0]._M_node = local_28;
  std::__cxx11::string::~string(local_48);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffdd8);
  bVar2 = std::operator==(local_18,local_60);
  if (!bVar2) {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x13b138);
    std::__cxx11::string::operator=((string *)(in_RDI + 8),(string *)&ppVar4->second);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::istringstream::istringstream(local_1e0,in_RDI + 8,8);
      cppcms::http::context::locale();
      std::ios::imbue(local_1e8);
      std::locale::~locale(local_1e8);
      std::locale::~locale(local_1f0);
      std::istream::operator>>(local_1e0,(int *)(in_RDI + 7));
      bVar3 = std::ios::fail();
      if (((bVar3 & 1) == 0) && (bVar3 = std::ios::eof(), (bVar3 & 1) != 0)) {
        cppcms::widgets::base_widget::set((bool)(cVar1 + (char)*(undefined8 *)(*in_RDI + -0x18)));
      }
      else {
        cppcms::widgets::base_widget::valid((bool)(cVar1 + (char)*(undefined8 *)(*in_RDI + -0x18)));
      }
      std::__cxx11::istringstream::~istringstream(local_1e0);
    }
  }
  return;
}

Assistant:

virtual void load(http::context &context)
			{
				pre_load(context);

				loaded_string_.clear();

				set(false);
				valid(true);

				http::request::form_type::const_iterator p;
				http::request::form_type const &request=context.request().post_or_get();
				p=request.find(name());
				if(p==request.end()) {
					return;
				}
				else {
					loaded_string_=p->second;
					if(loaded_string_.empty())
						return;

					std::istringstream ss(loaded_string_);
					ss.imbue(context.locale());
					ss>>value_;
					if(ss.fail() || !ss.eof())
						valid(false);
					else
						set(true);
				}
			}